

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_index.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  Index *pIVar1;
  int iVar2;
  Index *index;
  string index_file;
  Index *local_80;
  undefined1 *local_78 [2];
  undefined1 local_68 [16];
  undefined1 *local_58 [2];
  undefined1 local_48 [16];
  Options local_38;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"testing kv index...",0x13);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
  std::ostream::put(-0x70);
  std::ostream::flush();
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"test.idx","");
  local_38.page_type = kKeyPage;
  local_38.mem_page_size = 0x1000;
  local_38.mem_size = 0x100000;
  local_38.disk_page_size = 0x20000;
  local_38.bloom_filter_bit_per_key = 10;
  iVar2 = kvindex::Index::Open((string *)local_58,&local_38,&local_80);
  if (iVar2 == 0) {
    testBasicPutGet(local_80);
    generateDataFile("test.data");
    pIVar1 = local_80;
    local_78[0] = local_68;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"test.data","");
    (*(code *)**(undefined8 **)pIVar1)(pIVar1,local_78);
    if (local_78[0] != local_68) {
      operator_delete(local_78[0]);
    }
    testMemAndDiskPage(local_80);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"success",7);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
    std::ostream::put(-0x70);
    std::ostream::flush();
    if (local_58[0] != local_48) {
      operator_delete(local_58[0]);
    }
    return 0;
  }
  __assert_fail("kvindex::kOk == code",
                "/workspace/llm4binary/github/license_all_cmakelists_25/lxyhcx[P]kv_index/test/test_index.cpp"
                ,0x56,"int main(int, char **)");
}

Assistant:

int main(int argc, char *argv[])
{
    cout << "testing kv index..." << endl;
    string index_file("test.idx");
    kvindex::Index* index;
    kvindex::Options options;
    kvindex::ErrorCode code = kvindex::Index::Open(index_file, options, &index);
    assert(kvindex::kOk == code);

    testBasicPutGet(index);

    generateDataFile("test.data");
    index->LoadDataFrom("test.data");

    // After load data from data file, test get some keys in data file,
    // including keys in mem pages and disk pages.
    testMemAndDiskPage(index);

    cout << "success" << endl;
    return 0;
}